

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O0

void __thiscall cppurses::Terminal::uninit_default_pairs(Terminal *this)

{
  bool bVar1;
  short sVar2;
  short sVar3;
  undefined2 local_16;
  undefined2 local_14;
  Underlying_color_t fg;
  Underlying_color_t bg;
  Underlying_color_t max_color;
  Terminal *this_local;
  
  bVar1 = has_extended_colors(this);
  sVar2 = 8;
  if (bVar1) {
    sVar2 = 0x10;
  }
  for (local_14 = 0; local_14 < sVar2; local_14 = local_14 + 1) {
    sVar3 = color_index(this,7,local_14);
    init_pair((int)sVar3,7,(int)local_14);
  }
  for (local_16 = 0; local_16 < sVar2; local_16 = local_16 + 1) {
    if (local_16 != 7) {
      sVar3 = color_index(this,local_16,0);
      init_pair((int)sVar3,(int)local_16,0);
    }
  }
  return;
}

Assistant:

void Terminal::uninit_default_pairs() const
{
    Underlying_color_t max_color = this->has_extended_colors() ? 16 : 8;
    for (Underlying_color_t bg = 0; bg < max_color; ++bg) {
        ::init_pair(color_index(7, bg), 7, bg);
    }
    for (Underlying_color_t fg = 0; fg < max_color; ++fg) {
        if (fg != 7)
            ::init_pair(color_index(fg, 0), fg, 0);
    }
}